

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int __fd;
  int iVar2;
  int __fd_00;
  ostream *poVar3;
  undefined8 extraout_RAX;
  size_t __nbytes;
  int addrlen;
  int opt;
  string message;
  sockaddr_in address;
  AddressBook address_book;
  socklen_t local_98 [2];
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  sockaddr local_70;
  AddressBook local_60;
  
  local_98[1] = 1;
  local_98[0] = 0x10;
  __fd = socket(2,1,0);
  if (__fd == 0) {
LAB_001078e4:
    main_cold_5();
LAB_001078e9:
    main_cold_1();
  }
  else {
    iVar2 = setsockopt(__fd,1,0xf,local_98 + 1,4);
    if (iVar2 != 0) goto LAB_001078e9;
    local_70.sa_family = 2;
    local_70.sa_data[0] = '\'';
    local_70.sa_data[1] = '\x0f';
    local_70.sa_data[2] = '\0';
    local_70.sa_data[3] = '\0';
    local_70.sa_data[4] = '\0';
    local_70.sa_data[5] = '\0';
    iVar2 = bind(__fd,&local_70,0x10);
    if (-1 < iVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"server start listening on ",0x1a);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,9999);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"...\n",4);
      iVar2 = listen(__fd,3);
      if (iVar2 < 0) goto LAB_001078f3;
      iVar2 = 0;
      while( true ) {
        __fd_00 = accept(__fd,&local_70,local_98);
        if (__fd_00 == 0) {
          return 0;
        }
        if (__fd_00 < 0) break;
        local_90 = local_80;
        local_88 = 0;
        local_80[0] = 0;
        read(__fd_00,&local_90,__nbytes);
        Messages::AddressBook::AddressBook(&local_60,(Arena *)0x0);
        cVar1 = google::protobuf::MessageLite::ParseFromString((string *)&local_60);
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed to parse address book.",0x1d);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
          std::ostream::put('p');
          iVar2 = -1;
          std::ostream::flush();
        }
        else {
          list_people(&local_60);
        }
        Messages::AddressBook::~AddressBook(&local_60);
        if (local_90 != local_80) {
          operator_delete(local_90);
        }
        if (cVar1 == '\0') {
          return iVar2;
        }
      }
      main_cold_2();
      goto LAB_001078e4;
    }
  }
  main_cold_4();
LAB_001078f3:
  main_cold_3();
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int server_fd, new_socket; 
	struct sockaddr_in address; 
	int opt = 1; 
	int addrlen = sizeof(address); 
	
	// Creating socket file descriptor 
	if ((server_fd = socket(AF_INET, SOCK_STREAM, 0)) == 0) 
	{ 
		perror("socket failed"); 
		exit(EXIT_FAILURE); 
	} 
	
	// Forcefully attaching socket to the port 8080 
	if (setsockopt(server_fd, SOL_SOCKET, SO_REUSEADDR | SO_REUSEPORT, 
												&opt, sizeof(opt))) 
	{ 
		perror("setsockopt"); 
		exit(EXIT_FAILURE); 
	} 
	address.sin_family = AF_INET; 
	address.sin_addr.s_addr = INADDR_ANY; 
	address.sin_port = htons( PORT ); 
	
	// Forcefully attaching socket to the port 8080 
	if (bind(server_fd, (struct sockaddr *)&address, 
								sizeof(address))<0) 
	{ 
		perror("bind failed"); 
		exit(EXIT_FAILURE); 
	} 
	cout << "server start listening on "<< PORT <<"...\n";
	if (listen(server_fd, 3) < 0) 
	{ 
		perror("listen"); 
		exit(EXIT_FAILURE); 
	} 
	while ((new_socket = accept(server_fd, (struct sockaddr *)&address, 
					(socklen_t*)&addrlen))) 
	{ 
		if(new_socket < 0) {
			perror("accept"); 
			exit(EXIT_FAILURE); 
		} else
		{
			string message;
			read(new_socket, message);
			Messages::AddressBook address_book;
			if (!address_book.ParseFromString(message)) {
				cerr << "Failed to parse address book." << endl;
				return -1;
			}
			list_people(address_book);
		}
	} 

	return 0; 
}